

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-test-macros.c
# Opt level: O1

int run_test_test_macros(void)

{
  int64_t eval_b;
  int64_t eval_a;
  
  test_macros_evil::x = test_macros_evil::x + 3;
  return 0;
}

Assistant:

TEST_IMPL(test_macros) {
  char* a = "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  char* b = "ABCDEFGHIJKLMNOPQRSTUVWXYz";
  char* c = "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  int i;

  i = test_macros_evil();
  ASSERT_STR_NE(a, b);
  ASSERT_STR_EQ(a, c);
  ASSERT_EQ(i + 1, test_macros_evil());
  ASSERT_EQ(i + 2, test_macros_evil());
  return 0;
}